

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  long lVar2;
  int iVar3;
  size_t i;
  size_t sVar4;
  size_t i_1;
  long lVar5;
  array<unsigned_long,_26UL> histogram;
  long local_e8 [26];
  
  memset(local_e8,0,0xd0);
  for (sVar4 = 0; sVar4 != 0x4f92e; sVar4 = sVar4 + 1) {
    cVar1 = anon_var_dwarf_4c0[sVar4];
    iVar3 = -0x61;
    if (((byte)(cVar1 + 0x9fU) < 0x1a) || (iVar3 = -0x41, (byte)(cVar1 + 0xbfU) < 0x1a)) {
      local_e8[(uint)(iVar3 + cVar1)] = local_e8[(uint)(iVar3 + cVar1)] + 1;
    }
  }
  puts("Characters in \'On Liberty\':");
  for (lVar5 = 0; lVar5 != 0x1a; lVar5 = lVar5 + 1) {
    printf("%c: %zu\n",(ulong)((int)lVar5 + 0x61),local_e8[lVar5]);
  }
  lVar2 = 0;
  for (lVar5 = 0; lVar5 != 0xd0; lVar5 = lVar5 + 8) {
    lVar2 = lVar2 + *(long *)((long)local_e8 + lVar5);
  }
  printf("other: %zu\n",0x4f92e - lVar2);
  return 0;
}

Assistant:

int main() {
  std::array<size_t, 26> histogram = {};
  size_t length = k_books_on_liberty_txt_len;
  for (size_t i = 0; i < length; ++i) {
    char c = k_books_on_liberty_txt[i];
    if ('a' <= c && c <= 'z') {
      histogram[c-'a']++;
    } else if ('A' <= c && c <= 'Z') {
      histogram[c-'A']++;
    }
  }
  printf("Characters in 'On Liberty':\n");
  for (size_t i = 0; i < 26; ++i) {
    printf("%c: %zu\n", char('a'+i), histogram[i]);
  }
  size_t count = std::accumulate(histogram.cbegin(), histogram.cend(), size_t());
  printf("other: %zu\n", length - count);
}